

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O3

ze_result_t
zeCommandListAppendImageCopy
          (ze_command_list_handle_t hCommandList,ze_image_handle_t hDstImage,
          ze_image_handle_t hSrcImage,ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,
          ze_event_handle_t *phWaitEvents)

{
  code *UNRECOVERED_JUMPTABLE;
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_ERROR_UNINITIALIZED;
  if (ze_lib::destruction == '\0') {
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)(ze_lib::context + 0x10) + 0x270);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      zVar1 = (*UNRECOVERED_JUMPTABLE)();
      return zVar1;
    }
    zVar1 = (uint)*(byte *)(ze_lib::context + 0xd90) * 2 + ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return zVar1;
}

Assistant:

ze_result_t ZE_APICALL
zeCommandListAppendImageCopy(
    ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
    ze_image_handle_t hDstImage,                    ///< [in] handle of destination image to copy to
    ze_image_handle_t hSrcImage,                    ///< [in] handle of source image to copy from
    ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
    uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                    ///< if `nullptr == phWaitEvents`
    ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                    ///< on before launching
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnCommandListAppendImageCopy_t pfnAppendImageCopy = [&result] {
        auto pfnAppendImageCopy = ze_lib::context->zeDdiTable.load()->CommandList.pfnAppendImageCopy;
        if( nullptr == pfnAppendImageCopy ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnAppendImageCopy;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnAppendImageCopy( hCommandList, hDstImage, hSrcImage, hSignalEvent, numWaitEvents, phWaitEvents );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnAppendImageCopy = ze_lib::context->zeDdiTable.load()->CommandList.pfnAppendImageCopy;
    if( nullptr == pfnAppendImageCopy ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnAppendImageCopy( hCommandList, hDstImage, hSrcImage, hSignalEvent, numWaitEvents, phWaitEvents );
    #endif
}